

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O3

void __thiscall
TEST_MockExpectedCall_toStringForNoParametersMultiCallCalledLessThanExpectedTimes_Test::testBody
          (TEST_MockExpectedCall_toStringForNoParametersMultiCallCalledLessThanExpectedTimes_Test
           *this)

{
  UtestShell *pUVar1;
  char *pcVar2;
  TestTerminator *pTVar3;
  MockCheckedExpectedCall expectedCall;
  undefined1 local_c0 [176];
  
  MockCheckedExpectedCall::MockCheckedExpectedCall((MockCheckedExpectedCall *)(local_c0 + 0x10),2);
  SimpleString::SimpleString((SimpleString *)local_c0,"name");
  MockCheckedExpectedCall::withName
            ((MockCheckedExpectedCall *)(local_c0 + 0x10),(SimpleString *)local_c0);
  SimpleString::~SimpleString((SimpleString *)local_c0);
  MockCheckedExpectedCall::callWasMade((MockCheckedExpectedCall *)(local_c0 + 0x10),1);
  pUVar1 = UtestShell::getCurrent();
  MockCheckedExpectedCall::callToString((MockCheckedExpectedCall *)local_c0);
  pcVar2 = SimpleString::asCharString((SimpleString *)local_c0);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,"name -> no parameters (expected 2 calls, called 1 time)",pcVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x22a,pTVar3);
  SimpleString::~SimpleString((SimpleString *)local_c0);
  MockCheckedExpectedCall::~MockCheckedExpectedCall((MockCheckedExpectedCall *)(local_c0 + 0x10));
  return;
}

Assistant:

TEST(MockExpectedCall, toStringForNoParametersMultiCallCalledLessThanExpectedTimes)
{
    MockCheckedExpectedCall expectedCall(2);
    expectedCall.withName("name");
    expectedCall.callWasMade(1);
    STRCMP_EQUAL("name -> no parameters (expected 2 calls, called 1 time)", expectedCall.callToString().asCharString());
}